

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void sbc_ED(void)

{
  ubyte uVar1;
  ubyte uVar2;
  
  except = '\0';
  uVar1 = getbyte(pc);
  uVar2 = getbyte(pc + 1);
  temp1 = getbyte(CONCAT11(uVar2,uVar1));
  _AL = acc;
  _AH = temp1;
  ovr_f = '\0';
  carry_f = '\x01';
  pc = pc + 2;
  return;
}

Assistant:

void sbc_ED(void) {
    uint flags;
    uint answer;

    asm("push ax");
    CLE;
    temp1 = getbyte(getbyte(pc) + 0x100 * getbyte(pc + 1));

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("sbb AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = acc = answer;
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = (flags & 1) ^ 1;

    pc += 2;
}